

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.h
# Opt level: O3

bool __thiscall llbuild::basic::FileChecksumHasher::readAndDigest(FileChecksumHasher *this)

{
  FILE *__stream;
  size_t sVar1;
  uint8_t buffer [16384];
  undefined1 auStack_4018 [16384];
  
  __stream = fopen((this->path->_M_dataplus)._M_p,"rb");
  this->file = (FILE *)__stream;
  if (__stream != (FILE *)0x0) {
    sVar1 = fread(auStack_4018,1,0x4000,__stream);
    while (sVar1 != 0) {
      (*this->_vptr_FileChecksumHasher[3])(this,auStack_4018,sVar1);
      sVar1 = fread(auStack_4018,1,0x4000,(FILE *)this->file);
    }
    fclose((FILE *)this->file);
    (*this->_vptr_FileChecksumHasher[2])(this);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool readAndDigest() {
    this->file = std::fopen(path.c_str(), "rb");

    uint8_t buffer[4*4096];
    size_t bytesRead = 0;

    if (file != NULL) {
      while ((bytesRead = fread(buffer, 1, sizeof(buffer), file)) > 0) {
        update(buffer, bytesRead);
      }
      fclose(file);
      finalize();
      return true;
    } else {
      return false;
    }
  }